

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::AtomicCounterBufferStorageTestCase::initTestCaseIteration
          (AtomicCounterBufferStorageTestCase *this,GLuint sparse_bo)

{
  GLenum GVar1;
  uint uVar2;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  int sparse_bo_data_start_offset_minus_page;
  int sparse_bo_data_start_offset;
  int sparse_bo_data_size;
  bool result;
  AtomicCounterBufferStorageTestCase *pAStack_10;
  GLuint sparse_bo_local;
  AtomicCounterBufferStorageTestCase *this_local;
  
  sparse_bo_data_start_offset._3_1_ = 1;
  this->m_sparse_bo = sparse_bo;
  sparse_bo_data_start_offset_minus_page = 0;
  sparse_bo_data_size = sparse_bo;
  pAStack_10 = this;
  (*this->m_gl->bindBuffer)(0x8892,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x474);
  if ((this->m_all_pages_committed & 1U) == 0) {
    sparse_bo_data_start_offset_minus_page =
         (this->m_helper_bo_size_rounded / (uint)this->m_page_size) * this->m_page_size >> 1;
  }
  else {
    sparse_bo_data_start_offset_minus_page = this->m_helper_bo_size_rounded;
  }
  local_20 = this->m_page_size - (this->m_helper_bo_size_rounded >> 1);
  local_24 = local_20 - this->m_page_size;
  if ((int)local_24 < 0) {
    local_24 = 0;
  }
  this->m_sparse_bo_data_start_offset = local_20;
  local_28 = local_24;
  local_2c = this->m_page_size;
  uVar2 = SparseBufferTestUtilities::alignOffset(&local_28,&local_2c);
  this->m_sparse_bo_data_start_offset_rounded = uVar2;
  this->m_sparse_bo_data_size = sparse_bo_data_start_offset_minus_page;
  local_30 = this->m_sparse_bo_data_start_offset + sparse_bo_data_start_offset_minus_page;
  local_34 = this->m_page_size;
  uVar2 = SparseBufferTestUtilities::alignOffset(&local_30,&local_34);
  this->m_sparse_bo_data_size_rounded = uVar2;
  (*this->m_gl->bufferPageCommitmentARB)
            (0x8892,(ulong)this->m_sparse_bo_data_start_offset_rounded,
             (ulong)this->m_sparse_bo_data_size_rounded,'\x01');
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x49e);
  return (bool)(sparse_bo_data_start_offset._3_1_ & 1);
}

Assistant:

bool AtomicCounterBufferStorageTestCase::initTestCaseIteration(glw::GLuint sparse_bo)
{
	bool result = true;

	/* Cache the BO id, if not cached already */
	DE_ASSERT(m_sparse_bo == 0 || m_sparse_bo == sparse_bo);

	m_sparse_bo = sparse_bo;

	/* Set up the sparse bufffer. */
	int sparse_bo_data_size = 0;

	DE_ASSERT(m_helper_bo_size_rounded != 0);

	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	if (m_all_pages_committed)
	{
		/* Commit all required pages */
		sparse_bo_data_size = m_helper_bo_size_rounded;
	}
	else
	{
		/* Only commit the first half of the required pages */
		DE_ASSERT((m_helper_bo_size_rounded % m_page_size) == 0);

		sparse_bo_data_size = (m_helper_bo_size_rounded / m_page_size) * m_page_size / 2;
	}

	/* NOTE: We need to ensure that the memory region assigned to the atomic counter buffer spans
	 *       at least through two separate pages.
	 *
	 * Since we align up, we need to move one page backward and then apply the alignment function
	 * to determine the start page index.
	 */
	const int sparse_bo_data_start_offset			 = m_page_size - m_helper_bo_size_rounded / 2;
	int		  sparse_bo_data_start_offset_minus_page = sparse_bo_data_start_offset - m_page_size;

	if (sparse_bo_data_start_offset_minus_page < 0)
	{
		sparse_bo_data_start_offset_minus_page = 0;
	}

	m_sparse_bo_data_start_offset = sparse_bo_data_start_offset;
	m_sparse_bo_data_start_offset_rounded =
		SparseBufferTestUtilities::alignOffset(sparse_bo_data_start_offset_minus_page, m_page_size);
	m_sparse_bo_data_size = sparse_bo_data_size;
	m_sparse_bo_data_size_rounded =
		SparseBufferTestUtilities::alignOffset(m_sparse_bo_data_start_offset + sparse_bo_data_size, m_page_size);

	DE_ASSERT((m_sparse_bo_data_size_rounded % m_page_size) == 0);
	DE_ASSERT((m_sparse_bo_data_start_offset_rounded % m_page_size) == 0);

	m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, m_sparse_bo_data_start_offset_rounded, m_sparse_bo_data_size_rounded,
								 GL_TRUE); /* commit */

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

	return result;
}